

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dauCanon.c
# Opt level: O3

int Abc_TgExpendSymmetry(Abc_TgMan_t *pMan,char *pDest)

{
  int iVar1;
  int iVar2;
  long lVar3;
  int iVar4;
  byte *pbVar5;
  byte bVar6;
  
  iVar4 = pMan->nGVars;
  if (iVar4 < 1) {
    iVar1 = 0;
  }
  else {
    lVar3 = 0;
    iVar1 = 0;
    do {
      bVar6 = pMan->pPerm[lVar3];
      if (-1 < (char)bVar6) {
        pbVar5 = (byte *)(pDest + iVar1);
        do {
          *pbVar5 = bVar6;
          bVar6 = pMan->symLink[bVar6];
          pbVar5 = pbVar5 + 1;
          iVar1 = iVar1 + 1;
        } while (-1 < (char)bVar6);
        iVar4 = pMan->nGVars;
      }
      lVar3 = lVar3 + 1;
    } while (lVar3 < iVar4);
  }
  iVar4 = pMan->nVars;
  bVar6 = pMan->symLink[iVar4];
  iVar2 = iVar1;
  if (-1 < (char)bVar6) {
    pbVar5 = (byte *)(pDest + iVar1);
    do {
      *pbVar5 = bVar6;
      bVar6 = pMan->symLink[bVar6];
      pbVar5 = pbVar5 + 1;
      iVar2 = iVar2 + 1;
    } while (-1 < (char)bVar6);
    iVar4 = pMan->nVars;
  }
  if (iVar2 != iVar4) {
    __assert_fail("i == pMan->nVars",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/opt/dau/dauCanon.c"
                  ,0x7c1,"int Abc_TgExpendSymmetry(Abc_TgMan_t *, char *)");
  }
  return iVar1;
}

Assistant:

int Abc_TgExpendSymmetry(Abc_TgMan_t * pMan, char * pDest)
{
    int i = 0, j, k, s;
    char * pPerm = pMan->pPerm;
    for (j = 0; j < pMan->nGVars; j++)
        for (k = pPerm[j]; k >= 0; k = pMan->symLink[k])
            pDest[i++] = k;
    s = i;
    for (k = pMan->symLink[pMan->nVars]; k >= 0; k = pMan->symLink[k])
        pDest[i++] = k;
    assert(i == pMan->nVars);
    return s;
}